

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

char __thiscall
Fl_Preferences::get(Fl_Preferences *this,char *key,double *value,double defaultValue)

{
  char *__nptr;
  double local_38;
  char *v;
  double defaultValue_local;
  double *value_local;
  char *key_local;
  Fl_Preferences *this_local;
  
  __nptr = Node::get(this->node,key);
  local_38 = defaultValue;
  if (__nptr != (char *)0x0) {
    local_38 = atof(__nptr);
  }
  *value = local_38;
  return __nptr != (char *)0x0;
}

Assistant:

char Fl_Preferences::get( const char *key, double &value, double defaultValue ) {
  const char *v = node->get( key );
  value = v ? atof( v ) : defaultValue;
  return ( v != 0 );
}